

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_filter.c
# Opt level: O3

void FilterSegment(double *in_data,PitchFilterParam *parameters,double *out_data,
                  double (*out_dg) [264])

{
  double dVar1;
  int iVar2;
  int iVar3;
  PitchFilterOperation PVar4;
  uint uVar5;
  double *pdVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double (*padVar14) [5];
  uint uVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  
  iVar2 = parameters->num_samples;
  if (0 < iVar2) {
    iVar3 = parameters->lag_offset;
    lVar12 = (long)parameters->index;
    iVar8 = parameters->index + 0xbe;
    lVar16 = (long)iVar8;
    pdVar6 = parameters->interpol_coeff;
    PVar4 = parameters->mode;
    pdVar17 = parameters->buffer + (iVar8 - iVar3);
    lVar18 = lVar12 * 8 + (long)iVar3 * -8 + (long)out_dg;
    iVar8 = 0;
    do {
      dVar20 = parameters->damper_state[0];
      dVar1 = parameters->damper_state[1];
      dVar21 = parameters->damper_state[3];
      parameters->damper_state[3] = parameters->damper_state[2];
      parameters->damper_state[4] = dVar21;
      parameters->damper_state[1] = dVar20;
      parameters->damper_state[2] = dVar1;
      dVar20 = 0.0;
      lVar9 = 0;
      do {
        dVar20 = dVar20 + pdVar17[lVar9] * pdVar6[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 != 9);
      dVar1 = parameters->gain;
      parameters->damper_state[0] = dVar20 * dVar1;
      if (PVar4 == kPitchFilterPreGain) {
        lVar9 = lVar12 - iVar3;
        pdVar10 = parameters->damper_state_dg[0] + 4;
        uVar13 = 4;
        do {
          lVar19 = 0;
          do {
            *(undefined8 *)((long)pdVar10 + lVar19) = *(undefined8 *)((long)pdVar10 + lVar19 + -8);
            lVar19 = lVar19 + 0x28;
          } while (lVar19 != 0xa0);
          pdVar10 = pdVar10 + -1;
          bVar7 = 1 < uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar7);
        uVar5 = parameters->sub_frame;
        if (-1 < (int)uVar5) {
          uVar15 = (uint)(lVar9 >> 0x3f) & -(int)lVar9;
          lVar19 = 0;
          lVar9 = lVar18;
          do {
            dVar21 = 0.0;
            if ((int)uVar15 < 9) {
              lVar11 = 9;
              do {
                dVar21 = dVar21 + *(double *)(lVar9 + -8 + lVar11 * 8) * pdVar6[lVar11 + -1];
                lVar11 = lVar11 + -1;
              } while ((int)uVar15 < lVar11);
            }
            parameters->damper_state_dg[lVar19][0] =
                 parameters->gain_mult[lVar19] * dVar20 + dVar21 * dVar1;
            lVar19 = lVar19 + 1;
            lVar9 = lVar9 + 0x840;
          } while (lVar19 != (ulong)uVar5 + 1);
          if (-1 < (int)uVar5) {
            lVar9 = 0;
            padVar14 = parameters->damper_state_dg;
            do {
              dVar20 = 0.0;
              lVar19 = 0;
              do {
                dVar20 = dVar20 - *(double *)((long)*padVar14 + lVar19) *
                                  *(double *)((long)kDampFilter + lVar19);
                lVar19 = lVar19 + 8;
              } while (lVar19 != 0x28);
              out_dg[lVar9][lVar12] = dVar20;
              lVar9 = lVar9 + 1;
              padVar14 = padVar14 + 1;
            } while (lVar9 != (ulong)uVar5 + 1);
          }
        }
      }
      dVar20 = 0.0;
      lVar9 = 0;
      do {
        dVar20 = dVar20 + *(double *)((long)parameters->damper_state + lVar9) *
                          *(double *)((long)kDampFilter + lVar9);
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x28);
      dVar1 = in_data[lVar12];
      out_data[lVar12] = dVar1 - dVar20;
      parameters->buffer[lVar16] = (dVar1 - dVar20) + in_data[lVar12];
      lVar12 = lVar12 + 1;
      lVar16 = lVar16 + 1;
      iVar8 = iVar8 + 1;
      pdVar17 = pdVar17 + 1;
      lVar18 = lVar18 + 8;
    } while (iVar8 != iVar2);
    parameters->index = (int)lVar12;
  }
  return;
}

Assistant:

static void FilterSegment(const double* in_data, PitchFilterParam* parameters,
                          double* out_data,
                          double out_dg[][PITCH_FRAME_LEN + QLOOKAHEAD]) {
  int n;
  int m;
  int j;
  double sum;
  double sum2;
  /* Index of |parameters->buffer| where the output is written to. */
  int pos = parameters->index + PITCH_BUFFSIZE;
  /* Index of |parameters->buffer| where samples are read for fractional-lag
   * computation. */
  int pos_lag = pos - parameters->lag_offset;

  for (n = 0; n < parameters->num_samples; ++n) {
    /* Shift low pass filter states. */
    for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
      parameters->damper_state[m] = parameters->damper_state[m - 1];
    }
    /* Filter to get fractional pitch. */
    sum = 0.0;
    for (m = 0; m < PITCH_FRACORDER; ++m) {
      sum += parameters->buffer[pos_lag + m] * parameters->interpol_coeff[m];
    }
    /* Multiply with gain. */
    parameters->damper_state[0] = parameters->gain * sum;

    if (parameters->mode == kPitchFilterPreGain) {
      int lag_index = parameters->index - parameters->lag_offset;
      int m_tmp = (lag_index < 0) ? -lag_index : 0;
      /* Update the damper state for the new sample. */
      for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
        for (j = 0; j < 4; ++j) {
          parameters->damper_state_dg[j][m] =
              parameters->damper_state_dg[j][m - 1];
        }
      }

      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        /* Filter for fractional pitch. */
        sum2 = 0.0;
        for (m = PITCH_FRACORDER-1; m >= m_tmp; --m) {
          /* |lag_index + m| is always larger than or equal to zero, see how
           * m_tmp is computed. This is equivalent to assume samples outside
           * |out_dg[j]| are zero. */
          sum2 += out_dg[j][lag_index + m] * parameters->interpol_coeff[m];
        }
        /* Add the contribution of differential gain change. */
        parameters->damper_state_dg[j][0] = parameters->gain_mult[j] * sum +
            parameters->gain * sum2;
      }

      /* Filter with damping filter, and store the results. */
      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        sum = 0.0;
        for (m = 0; m < PITCH_DAMPORDER; ++m) {
          sum -= parameters->damper_state_dg[j][m] * kDampFilter[m];
        }
        out_dg[j][parameters->index] = sum;
      }
    }
    /* Filter with damping filter. */
    sum = 0.0;
    for (m = 0; m < PITCH_DAMPORDER; ++m) {
      sum += parameters->damper_state[m] * kDampFilter[m];
    }

    /* Subtract from input and update buffer. */
    out_data[parameters->index] = in_data[parameters->index] - sum;
    parameters->buffer[pos] = in_data[parameters->index] +
        out_data[parameters->index];

    ++parameters->index;
    ++pos;
    ++pos_lag;
  }
  return;
}